

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_common.cpp
# Opt level: O0

SplitScaleBias *
dxil_spv::split_index_scale_bias(SplitScaleBias *__return_storage_ptr__,Value *value)

{
  BinaryOps BVar1;
  Constant *pCVar2;
  APInt *pAVar3;
  uint64_t uVar4;
  BinaryOperator *this;
  Value *pVVar5;
  Constant *pCVar6;
  SplitScaleBias *split;
  ConstantInt *const1_1;
  ConstantInt *const0_1;
  ConstantInt *const1;
  ConstantInt *const0;
  BinaryOperator *binop;
  ConstantInt *cint;
  Value *value_local;
  
  pCVar2 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(value)->super_Constant;
  if (pCVar2 == (Constant *)0x0) {
    this = LLVMBC::dyn_cast<LLVMBC::BinaryOperator>(value);
    if (this == (BinaryOperator *)0x0) {
      memset(__return_storage_ptr__,0,0x18);
    }
    else {
      BVar1 = LLVMBC::BinaryOperator::getOpcode(this);
      if (BVar1 == Add) {
        pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
        pCVar2 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar5)->super_Constant;
        pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
        pCVar6 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar5)->super_Constant;
        if ((pCVar2 != (Constant *)0x0) && (pCVar6 == (Constant *)0x0)) {
          pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
          split_index_scale_bias(__return_storage_ptr__,pVVar5);
          pAVar3 = LLVMBC::Constant::getUniqueInteger(pCVar2);
          uVar4 = LLVMBC::APInt::getZExtValue(pAVar3);
          __return_storage_ptr__->elem = __return_storage_ptr__->elem + (int)uVar4;
          return __return_storage_ptr__;
        }
        if ((pCVar2 == (Constant *)0x0) && (pCVar6 != (Constant *)0x0)) {
          pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
          split_index_scale_bias(__return_storage_ptr__,pVVar5);
          pAVar3 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          uVar4 = LLVMBC::APInt::getZExtValue(pAVar3);
          __return_storage_ptr__->elem = __return_storage_ptr__->elem + (int)uVar4;
          return __return_storage_ptr__;
        }
      }
      else {
        BVar1 = LLVMBC::BinaryOperator::getOpcode(this);
        if (BVar1 == Mul) {
          pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
          pCVar2 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar5)->super_Constant;
          pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
          pCVar6 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar5)->super_Constant;
          if ((pCVar2 != (Constant *)0x0) && (pCVar6 == (Constant *)0x0)) {
            pAVar3 = LLVMBC::Constant::getUniqueInteger(pCVar2);
            uVar4 = LLVMBC::APInt::getZExtValue(pAVar3);
            __return_storage_ptr__->stride = (uint32_t)uVar4;
            pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,1);
            __return_storage_ptr__->index = pVVar5;
            __return_storage_ptr__->elem = 0;
            return __return_storage_ptr__;
          }
          if ((pCVar2 == (Constant *)0x0) && (pCVar6 != (Constant *)0x0)) {
            pAVar3 = LLVMBC::Constant::getUniqueInteger(pCVar6);
            uVar4 = LLVMBC::APInt::getZExtValue(pAVar3);
            __return_storage_ptr__->stride = (uint32_t)uVar4;
            pVVar5 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
            __return_storage_ptr__->index = pVVar5;
            __return_storage_ptr__->elem = 0;
            return __return_storage_ptr__;
          }
        }
      }
      memset(__return_storage_ptr__,0,0x18);
    }
  }
  else {
    __return_storage_ptr__->stride = 0xffffffff;
    __return_storage_ptr__->index = (Value *)0x0;
    pAVar3 = LLVMBC::Constant::getUniqueInteger(pCVar2);
    uVar4 = LLVMBC::APInt::getZExtValue(pAVar3);
    __return_storage_ptr__->elem = (uint32_t)uVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

SplitScaleBias split_index_scale_bias(const llvm::Value *value)
{
	const auto *cint = llvm::dyn_cast<llvm::ConstantInt>(value);
	// Return UINT32_MAX as stride since we cannot reasonably know yet.
	if (cint)
		return { UINT32_MAX, nullptr, uint32_t(cint->getUniqueInteger().getZExtValue()) };

	const auto *binop = llvm::dyn_cast<llvm::BinaryOperator>(value);
	if (!binop)
		return {};

	if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Add)
	{
		const auto *const0 = llvm::dyn_cast<llvm::ConstantInt>(binop->getOperand(0));
		const auto *const1 = llvm::dyn_cast<llvm::ConstantInt>(binop->getOperand(1));
		if (const0 && !const1)
		{
			auto split = split_index_scale_bias(binop->getOperand(1));
			split.elem += const0->getUniqueInteger().getZExtValue();
			return split;
		}
		else if (!const0 && const1)
		{
			auto split = split_index_scale_bias(binop->getOperand(0));
			split.elem += const1->getUniqueInteger().getZExtValue();
			return split;
		}
	}
	else if (binop->getOpcode() == llvm::BinaryOperator::BinaryOps::Mul)
	{
		const auto *const0 = llvm::dyn_cast<llvm::ConstantInt>(binop->getOperand(0));
		const auto *const1 = llvm::dyn_cast<llvm::ConstantInt>(binop->getOperand(1));
		if (const0 && !const1)
			return { uint32_t(const0->getUniqueInteger().getZExtValue()), binop->getOperand(1), 0 };
		else if (!const0 && const1)
			return { uint32_t(const1->getUniqueInteger().getZExtValue()), binop->getOperand(0), 0 };
	}

	return {};
}